

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_copy_tree(xml_node_struct *dn,xml_node_struct *sn)

{
  xml_allocator *alloc_00;
  xml_allocator *pxVar1;
  xml_node_struct *dn_00;
  bool bVar2;
  xml_allocator *local_50;
  xml_node_struct *copy;
  xml_node_struct *sit;
  xml_node_struct *dit;
  xml_allocator *shared_alloc;
  xml_allocator *alloc;
  xml_node_struct *sn_local;
  xml_node_struct *dn_local;
  
  alloc_00 = get_allocator<pugi::xml_node_struct>(dn);
  pxVar1 = get_allocator<pugi::xml_node_struct>(sn);
  local_50 = alloc_00;
  if (alloc_00 != pxVar1) {
    local_50 = (xml_allocator *)0x0;
  }
  node_copy_contents(dn,sn,local_50);
  copy = sn->first_child;
  sit = dn;
  do {
    while( true ) {
      if (copy == (xml_node_struct *)0x0 || copy == sn) {
        bVar2 = true;
        if (copy != (xml_node_struct *)0x0) {
          bVar2 = sit == dn->parent;
        }
        if (!bVar2) {
          __assert_fail("!sit || dit == dn->parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                        ,0x118e,
                        "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                       );
        }
        return;
      }
      if (sit == (xml_node_struct *)0x0) {
        __assert_fail("dit",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x1168,
                      "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                     );
      }
      if (((copy == dn) ||
          (dn_00 = append_new_node(sit,alloc_00,
                                   (xml_node_type)copy->header & (node_doctype|node_declaration)),
          dn_00 == (xml_node_struct *)0x0)) ||
         (node_copy_contents(dn_00,copy,local_50), copy->first_child == (xml_node_struct *)0x0))
      break;
      copy = copy->first_child;
      sit = dn_00;
    }
    do {
      if (copy->next_sibling != (xml_node_struct *)0x0) {
        copy = copy->next_sibling;
        break;
      }
      copy = copy->parent;
      sit = sit->parent;
      if (copy != sn && sit == (xml_node_struct *)0x0) {
        __assert_fail("sit == sn || dit",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x1189,
                      "void pugi::impl::(anonymous namespace)::node_copy_tree(xml_node_struct *, xml_node_struct *)"
                     );
      }
    } while (copy != sn);
  } while( true );
}

Assistant:

PUGI__FN void node_copy_tree(xml_node_struct* dn, xml_node_struct* sn)
	{
		xml_allocator& alloc = get_allocator(dn);
		xml_allocator* shared_alloc = (&alloc == &get_allocator(sn)) ? &alloc : 0;

		node_copy_contents(dn, sn, shared_alloc);

		xml_node_struct* dit = dn;
		xml_node_struct* sit = sn->first_child;

		while (sit && sit != sn)
		{
			// loop invariant: dit is inside the subtree rooted at dn
			assert(dit);

			// when a tree is copied into one of the descendants, we need to skip that subtree to avoid an infinite loop
			if (sit != dn)
			{
				xml_node_struct* copy = append_new_node(dit, alloc, PUGI__NODETYPE(sit));

				if (copy)
				{
					node_copy_contents(copy, sit, shared_alloc);

					if (sit->first_child)
					{
						dit = copy;
						sit = sit->first_child;
						continue;
					}
				}
			}

			// continue to the next node
			do
			{
				if (sit->next_sibling)
				{
					sit = sit->next_sibling;
					break;
				}

				sit = sit->parent;
				dit = dit->parent;

				// loop invariant: dit is inside the subtree rooted at dn while sit is inside sn
				assert(sit == sn || dit);
			}
			while (sit != sn);
		}

		assert(!sit || dit == dn->parent);
	}